

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::D_formatter<spdlog::details::null_scoped_padder>::format
          (D_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  ulong uVar2;
  
  fmt_helper::pad2(tm_time->tm_mon + 1,dest);
  sVar1 = (dest->super_buffer<char>).size_;
  uVar2 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar2 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar2;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  fmt_helper::pad2(tm_time->tm_mday,dest);
  sVar1 = (dest->super_buffer<char>).size_;
  uVar2 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar2 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar2;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  fmt_helper::pad2(tm_time->tm_year % 100,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }